

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphviz.cc
# Opt level: O2

void __thiscall GraphViz::AddTarget(GraphViz *this,Node *node)

{
  Node *node_00;
  pointer ppNVar1;
  pointer ppNVar2;
  bool bVar3;
  iterator iVar4;
  iterator iVar5;
  char *pcVar6;
  pointer ppNVar7;
  pointer ppNVar8;
  Edge *edge;
  string err;
  string pathstr;
  Edge *local_80;
  Node *local_78;
  string local_70;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  long local_48;
  
  local_78 = node;
  iVar4 = std::
          _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
          ::find(&(this->visited_nodes_)._M_t,&local_78);
  if ((_Rb_tree_header *)iVar4._M_node == &(this->visited_nodes_)._M_t._M_impl.super__Rb_tree_header
     ) {
    std::__cxx11::string::string((string *)&local_50,(string *)local_78);
    local_70._M_dataplus._M_p._0_1_ = 0x5c;
    local_80 = (Edge *)CONCAT71(local_80._1_7_,0x2f);
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(local_50._M_current + local_48),(char *)&local_70,(char *)&local_80);
    printf("\"%p\" [label=\"%s\"]\n",local_78,local_50._M_current);
    std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
    _M_insert_unique<Node*const&>
              ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *
               )&this->visited_nodes_,&local_78);
    local_80 = local_78->in_edge_;
    if (local_80 != (Edge *)0x0) {
      iVar5 = std::
              _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_EdgeCmp,_std::allocator<Edge_*>_>::
              find(&(this->visited_edges_)._M_t,&local_80);
      if ((_Rb_tree_header *)iVar5._M_node ==
          &(this->visited_edges_)._M_t._M_impl.super__Rb_tree_header) {
        std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>>::
        _M_insert_unique<Edge*const&>
                  ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,EdgeCmp,std::allocator<Edge*>> *)
                   &this->visited_edges_,&local_80);
        node_00 = local_80->dyndep_;
        if ((node_00 != (Node *)0x0) && (node_00->dyndep_pending_ == true)) {
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          local_70._M_string_length = 0;
          local_70.field_2._M_local_buf[0] = '\0';
          bVar3 = DyndepLoader::LoadDyndeps(&this->dyndep_loader_,node_00,&local_70);
          if (!bVar3) {
            Warning("%s\n",local_70._M_dataplus._M_p);
          }
          std::__cxx11::string::~string((string *)&local_70);
        }
        ppNVar7 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if (((long)(local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ppNVar7 == 8) &&
           (ppNVar8 = (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
           (long)(local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)ppNVar8 == 8)) {
          printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",*ppNVar7,*ppNVar8,
                 (local_80->rule_->name_)._M_dataplus._M_p);
        }
        else {
          printf("\"%p\" [label=\"%s\", shape=ellipse]\n",local_80,
                 (local_80->rule_->name_)._M_dataplus._M_p);
          for (ppNVar7 = (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              ppNVar7 !=
              (local_80->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppNVar7 = ppNVar7 + 1) {
            printf("\"%p\" -> \"%p\"\n",local_80,*ppNVar7);
          }
          ppNVar7 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
          ppNVar8 = ppNVar7;
          for (; ppNVar1 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish, ppNVar7 != ppNVar1;
              ppNVar7 = ppNVar7 + 1) {
            ppNVar2 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            pcVar6 = "";
            if ((ulong)(((long)ppNVar1 - (long)ppNVar2 >> 3) - (long)local_80->order_only_deps_) <=
                (ulong)((long)ppNVar8 - (long)ppNVar2 >> 3)) {
              pcVar6 = " style=dotted";
            }
            printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n",*ppNVar7,local_80,pcVar6);
            ppNVar8 = ppNVar8 + 1;
          }
        }
        for (ppNVar7 = (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                       _M_impl.super__Vector_impl_data._M_start;
            ppNVar7 !=
            (local_80->inputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish; ppNVar7 = ppNVar7 + 1) {
          AddTarget(this,*ppNVar7);
        }
      }
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void GraphViz::AddTarget(Node* node) {
  if (visited_nodes_.find(node) != visited_nodes_.end())
    return;

  string pathstr = node->path();
  replace(pathstr.begin(), pathstr.end(), '\\', '/');
  printf("\"%p\" [label=\"%s\"]\n", node, pathstr.c_str());
  visited_nodes_.insert(node);

  Edge* edge = node->in_edge();

  if (!edge) {
    // Leaf node.
    // Draw as a rect?
    return;
  }

  if (visited_edges_.find(edge) != visited_edges_.end())
    return;
  visited_edges_.insert(edge);

  if (edge->dyndep_ && edge->dyndep_->dyndep_pending()) {
    std::string err;
    if (!dyndep_loader_.LoadDyndeps(edge->dyndep_, &err)) {
      Warning("%s\n", err.c_str());
    }
  }

  if (edge->inputs_.size() == 1 && edge->outputs_.size() == 1) {
    // Can draw simply.
    // Note extra space before label text -- this is cosmetic and feels
    // like a graphviz bug.
    printf("\"%p\" -> \"%p\" [label=\" %s\"]\n",
           edge->inputs_[0], edge->outputs_[0], edge->rule_->name().c_str());
  } else {
    printf("\"%p\" [label=\"%s\", shape=ellipse]\n",
           edge, edge->rule_->name().c_str());
    for (vector<Node*>::iterator out = edge->outputs_.begin();
         out != edge->outputs_.end(); ++out) {
      printf("\"%p\" -> \"%p\"\n", edge, *out);
    }
    for (vector<Node*>::iterator in = edge->inputs_.begin();
         in != edge->inputs_.end(); ++in) {
      const char* order_only = "";
      if (edge->is_order_only(in - edge->inputs_.begin()))
        order_only = " style=dotted";
      printf("\"%p\" -> \"%p\" [arrowhead=none%s]\n", (*in), edge, order_only);
    }
  }

  for (vector<Node*>::iterator in = edge->inputs_.begin();
       in != edge->inputs_.end(); ++in) {
    AddTarget(*in);
  }
}